

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

bool EV_DoFloor(EFloor floortype,line_t_conflict *line,int tag,double speed,double height,int crush,
               int change,bool hexencrush,bool hereticlower)

{
  bool bVar1;
  FSectorTagIterator local_4c;
  FSectorTagIterator it;
  bool rtn;
  int secnum;
  bool hereticlower_local;
  bool hexencrush_local;
  int change_local;
  int crush_local;
  double height_local;
  double speed_local;
  int tag_local;
  line_t_conflict *line_local;
  EFloor floortype_local;
  
  it.searchtag._3_1_ = 0;
  FSectorTagIterator::FSectorTagIterator(&local_4c,tag,line);
  while( true ) {
    it.start = FSectorTagIterator::Next(&local_4c);
    if (it.start < 0) break;
    bVar1 = P_CreateFloor(sectors + it.start,floortype,line,speed,height,crush,change,hexencrush,
                          hereticlower);
    it.searchtag._3_1_ = (it.searchtag._3_1_ & 1) != 0 || bVar1;
  }
  return (bool)(it.searchtag._3_1_ & 1);
}

Assistant:

bool EV_DoFloor (DFloor::EFloor floortype, line_t *line, int tag,
				 double speed, double height, int crush, int change, bool hexencrush, bool hereticlower)
{
	int 		secnum;
	bool 		rtn = false;

	// check if a manual trigger; if so do just the sector on the backside
	FSectorTagIterator it(tag, line);
	while ((secnum = it.Next()) >= 0)
	{
		rtn |= P_CreateFloor(&sectors[secnum], floortype, line, speed, height, crush, change, hexencrush, hereticlower);
	}
	return rtn;
}